

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_map_to_edge(REF_INT map)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 0xb;
  uVar1 = 0x800;
  do {
    iVar2 = (int)uVar3;
    if ((int)uVar1 <= map) {
      printf("edge %d bit %d\n",uVar3,(ulong)uVar1);
      map = map - uVar1;
    }
    uVar1 = (int)uVar1 / 2;
    uVar3 = (ulong)(iVar2 - 1);
  } while (iVar2 != 0);
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_map_to_edge(REF_INT map) {
  REF_INT edge, bit;

  bit = 2048;
  for (edge = 11; edge >= 0; edge--) {
    if (map >= bit) {
      map -= bit;
      printf("edge %d bit %d\n", edge, bit);
    }
    bit /= 2;
  }

  return REF_SUCCESS;
}